

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

Type * soul::SanityCheckPass::PostResolutionChecks::getDataTypeOfArrayRefLHS
                 (Type *__return_storage_ptr__,ASTObject *o)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  BoundedIntSize BVar4;
  bool bVar5;
  long lVar6;
  long *plVar7;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  long local_38;
  vector<soul::Type,_std::allocator<soul::Type>_> local_30;
  
  lVar6 = __dynamic_cast(o,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,0);
  if (((lVar6 != 0) && (*(EndpointDetails **)(lVar6 + 0x38) != (EndpointDetails *)0x0)) &&
     (bVar5 = AST::EndpointDetails::isResolved(*(EndpointDetails **)(lVar6 + 0x38)), bVar5)) {
    if (*(EndpointDetails **)(lVar6 + 0x38) != (EndpointDetails *)0x0) {
      AST::EndpointDetails::getSampleArrayTypes(&local_30,*(EndpointDetails **)(lVar6 + 0x38));
      CVar2 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->arrayElementCategory;
      bVar5 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->isRef;
      bVar3 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->isConstant;
      __return_storage_ptr__->category =
           (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start)->category;
      __return_storage_ptr__->arrayElementCategory = CVar2;
      __return_storage_ptr__->isRef = bVar5;
      __return_storage_ptr__->isConstant = bVar3;
      (__return_storage_ptr__->primitiveType).type =
           ((local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->primitiveType).type;
      BVar4 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->arrayElementBoundingSize;
      __return_storage_ptr__->boundingSize =
           (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start)->boundingSize;
      __return_storage_ptr__->arrayElementBoundingSize = BVar4;
      pSVar1 = ((local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                 super__Vector_impl_data._M_start)->structure).object;
      (__return_storage_ptr__->structure).object = pSVar1;
      if (pSVar1 != (Structure *)0x0) {
        (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
      }
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_30);
      return __return_storage_ptr__;
    }
LAB_0020b0be:
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  plVar7 = (long *)__dynamic_cast(o,&AST::ASTObject::typeinfo,&AST::Expression::typeinfo,0);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 0x40))(&local_38,plVar7);
    if (((local_38 == 0) || (*(EndpointDetails **)(local_38 + 0x38) == (EndpointDetails *)0x0)) ||
       (bVar5 = AST::EndpointDetails::isResolved(*(EndpointDetails **)(local_38 + 0x38)), !bVar5)) {
      (**(code **)(*plVar7 + 0x20))(__return_storage_ptr__,plVar7);
    }
    else {
      if (local_38 == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      if (*(EndpointDetails **)(local_38 + 0x38) == (EndpointDetails *)0x0) goto LAB_0020b0be;
      AST::EndpointDetails::getSampleArrayTypes(&local_30,*(EndpointDetails **)(local_38 + 0x38));
      CVar2 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->arrayElementCategory;
      bVar5 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->isRef;
      bVar3 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->isConstant;
      __return_storage_ptr__->category =
           (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start)->category;
      __return_storage_ptr__->arrayElementCategory = CVar2;
      __return_storage_ptr__->isRef = bVar5;
      __return_storage_ptr__->isConstant = bVar3;
      (__return_storage_ptr__->primitiveType).type =
           ((local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start)->primitiveType).type;
      BVar4 = (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
               super__Vector_impl_data._M_start)->arrayElementBoundingSize;
      __return_storage_ptr__->boundingSize =
           (local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start)->boundingSize;
      __return_storage_ptr__->arrayElementBoundingSize = BVar4;
      pSVar1 = ((local_30.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                 super__Vector_impl_data._M_start)->structure).object;
      (__return_storage_ptr__->structure).object = pSVar1;
      if (pSVar1 != (Structure *)0x0) {
        (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
      }
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_30);
    }
    if (plVar7 != (long *)0x0) {
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->category = invalid;
  __return_storage_ptr__->arrayElementCategory = invalid;
  __return_storage_ptr__->isRef = false;
  __return_storage_ptr__->isConstant = false;
  __return_storage_ptr__->primitiveType = invalid;
  __return_storage_ptr__->boundingSize = 0;
  __return_storage_ptr__->arrayElementBoundingSize = 0;
  (__return_storage_ptr__->structure).object = (Structure *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static Type getDataTypeOfArrayRefLHS (AST::ASTObject& o)
        {
            if (auto e = cast<AST::EndpointDeclaration> (o))
                if (e->isResolved())
                    return e->getDetails().getSampleArrayTypes().front();

            if (auto e = cast<AST::Expression> (o))
            {
                if (auto endpoint = e->getAsEndpoint())
                    if (endpoint->isResolved())
                        return endpoint->getDetails().getSampleArrayTypes().front();

                return e->getResultType();
            }

            return {};
        }